

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# findstr.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  pointer *this;
  bool bVar1;
  bool bVar2;
  int iVar3;
  vector<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *this_00;
  reference args_00;
  char *pcVar4;
  __tuple_element_t<0UL,_tuple<basic_string<char,_char_traits<char>,_allocator<char>_>,_fileent>_>
  *fn_00;
  stopsearch *anon_var_0_1;
  exception *e_1;
  stopsearch *anon_var_0;
  exception *e;
  type *ent;
  type *fn;
  undefined1 local_448 [8];
  iter __end5;
  iter __begin5;
  fileenumerator *__range5;
  stat st;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  bool stop;
  pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  *bm;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *__range2;
  value_type local_2b0;
  int local_290;
  allocator<char> local_289;
  value_type local_288;
  allocator<char> local_261;
  value_type local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  char *local_140;
  char *mode;
  ArgIterator *arg;
  ArgIterator __end1;
  ArgIterator __begin1;
  ArgParser local_d0;
  ArgParser *local_c0;
  ArgParser *__range1;
  string excludepaths;
  findstr f;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  bool recurse_dirs;
  char **argv_local;
  int argc_local;
  
  bVar1 = false;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&f.bytemasks.
               super__Vector_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage);
  findstr::findstr((findstr *)((long)&excludepaths.field_2 + 8));
  std::__cxx11::string::string((string *)&__range1);
  ArgParser::ArgParser(&local_d0,argc,argv);
  local_c0 = &local_d0;
  ArgParser::begin((ArgIterator *)&__end1.longmatch,local_c0);
  ArgParser::end((ArgIterator *)&arg,local_c0);
  while (bVar2 = operator!=((ArgIterator *)&__end1.longmatch,(ArgIterator *)&arg), bVar2) {
    mode = (char *)ArgParser::ArgIterator::operator*((ArgIterator *)&__end1.longmatch);
    iVar3 = ArgParser::ArgIterator::option((ArgIterator *)mode);
    switch(iVar3) {
    case 0:
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,"-",&local_261);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&f.bytemasks.
                      super__Vector_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_260);
      std::__cxx11::string::~string((string *)&local_260);
      std::allocator<char>::~allocator(&local_261);
      break;
    default:
      usage();
      argv_local._4_4_ = 1;
      goto LAB_0010bad5;
    case 0x30:
      excludepaths.field_2._M_local_buf[0xb] = '\x01';
      break;
    case 0x31:
      excludepaths.field_2._M_local_buf[0xc] = '\x01';
      break;
    case 0x49:
      excludepaths.field_2._M_local_buf[10] = '\x01';
      break;
    case 0x4d:
      f._8_8_ = ArgParser::ArgIterator::getint((ArgIterator *)mode);
      break;
    case 0x51:
      f._7_1_ = 1;
      break;
    case 0x53:
      local_140 = ArgParser::ArgIterator::getstr((ArgIterator *)mode);
      s_abi_cxx11_(&local_160,"regex",5);
      bVar2 = std::operator==(&local_160,local_140);
      std::__cxx11::string::~string((string *)&local_160);
      if (bVar2) {
        f.nameprinted = false;
        f._25_3_ = 0;
      }
      else {
        s_abi_cxx11_(&local_180,"std",3);
        bVar2 = std::operator==(&local_180,local_140);
        std::__cxx11::string::~string((string *)&local_180);
        if (bVar2) {
          f.nameprinted = true;
          f._25_3_ = 0;
        }
        else {
          s_abi_cxx11_(&local_1a0,"stdbm",5);
          bVar2 = std::operator==(&local_1a0,local_140);
          std::__cxx11::string::~string((string *)&local_1a0);
          if (bVar2) {
            f.nameprinted = true;
            f._25_3_ = 0;
          }
          else {
            s_abi_cxx11_(&local_1c0,"stdbmh",6);
            bVar2 = std::operator==(&local_1c0,local_140);
            std::__cxx11::string::~string((string *)&local_1c0);
            if (bVar2) {
              f.nameprinted = true;
              f._25_3_ = 0;
            }
            else {
              s_abi_cxx11_(&local_1e0,"boostbm",7);
              bVar2 = std::operator==(&local_1e0,local_140);
              std::__cxx11::string::~string((string *)&local_1e0);
              if (bVar2) {
                f.nameprinted = true;
                f._25_3_ = 0;
              }
              else {
                s_abi_cxx11_(&local_200,"boostbmh",8);
                bVar2 = std::operator==(&local_200,local_140);
                std::__cxx11::string::~string((string *)&local_200);
                if (bVar2) {
                  f.nameprinted = true;
                  f._25_3_ = 0;
                }
                else {
                  s_abi_cxx11_(&local_220,"boostkmp",8);
                  bVar2 = std::operator==(&local_220,local_140);
                  std::__cxx11::string::~string((string *)&local_220);
                  if (bVar2) {
                    f.nameprinted = true;
                    f._25_3_ = 0;
                  }
                  else {
                    s_abi_cxx11_(&local_240,"mask",4);
                    bVar2 = std::operator==(&local_240,local_140);
                    std::__cxx11::string::~string((string *)&local_240);
                    if (bVar2) {
                      f.nameprinted = true;
                      f._25_3_ = 0;
                    }
                  }
                }
              }
            }
          }
        }
      }
      break;
    case 0x62:
      excludepaths.field_2._M_local_buf[9] = '\x01';
      break;
    case 99:
      f.pattern_is_hex = true;
      break;
    case 0x66:
      f.pattern_is_guid = true;
      break;
    case 0x67:
      excludepaths.field_2._M_local_buf[0xe] = '\x01';
      break;
    case 0x6c:
      f.firstmatch = true;
      break;
    case 0x72:
      bVar1 = true;
      break;
    case 0x76:
      iVar3 = ArgParser::ArgIterator::count((ArgIterator *)mode);
      f._0_4_ = iVar3 + f._0_4_;
      break;
    case 0x77:
      excludepaths.field_2._M_local_buf[8] = '\x01';
      break;
    case 0x78:
      excludepaths.field_2._M_local_buf[0xd] = '\x01';
      break;
    case -1:
      bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &f.searchtype);
      if (bVar2) {
        pcVar4 = ArgParser::ArgIterator::getstr((ArgIterator *)mode);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &f.searchtype,pcVar4);
      }
      else {
        pcVar4 = ArgParser::ArgIterator::getstr((ArgIterator *)mode);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,pcVar4,&local_289);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&f.bytemasks.
                        super__Vector_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_288);
        std::__cxx11::string::~string((string *)&local_288);
        std::allocator<char>::~allocator(&local_289);
      }
    }
    ArgParser::ArgIterator::operator++((ArgIterator *)&__end1.longmatch);
  }
  bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &f.searchtype);
  if (bVar2) {
    usage();
    argv_local._4_4_ = 1;
  }
  else {
    if ((excludepaths.field_2._M_local_buf[0xd] & 1U) != 0) {
      excludepaths.field_2._M_local_buf[9] = '\x01';
      excludepaths.field_2._M_local_buf[10] = '\x01';
    }
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&f.bytemasks.
                        super__Vector_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b0,"-",(allocator<char> *)((long)&__range2 + 7));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&f.bytemasks.
                      super__Vector_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_2b0);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    }
    bVar2 = findstr::compile_pattern((findstr *)((long)&excludepaths.field_2 + 8));
    if (bVar2) {
      if (1 < (int)f._0_4_) {
        print<std::__cxx11::string&>
                  ("Compiled regex: %s\n",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &f.searchtype);
        this_00 = (vector<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                   *)((long)&f.pattern.field_2 + 8);
        __end2 = std::
                 vector<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                 ::begin(this_00);
        bm = (pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)std::
                vector<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                ::end(this_00);
        while (bVar2 = __gnu_cxx::
                       operator==<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_std::vector<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                                 (&__end2,(__normal_iterator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_std::vector<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                                           *)&bm), ((bVar2 ^ 0xffU) & 1) != 0) {
          args_00 = __gnu_cxx::
                    __normal_iterator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_std::vector<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                    ::operator*(&__end2);
          print<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                    ("Compiled bytes: %-b\n",&args_00->first);
          print<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                    ("Compiled  mask: %-b\n",&args_00->second);
          __gnu_cxx::
          __normal_iterator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_*,_std::vector<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
          ::operator++(&__end2);
        }
      }
      this = &f.bytemasks.
              super__Vector_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
      __end1_1 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)this);
      arg_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)this);
      while (bVar2 = __gnu_cxx::
                     operator==<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               (&__end1_1,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)&arg_1), ((bVar2 ^ 0xffU) & 1) != 0) {
        st.__glibc_reserved[2] =
             (__syscall_slong_t)
             __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1_1);
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )st.__glibc_reserved[2],"-");
        if (bVar2) {
          findstr::searchstdin((findstr *)((long)&excludepaths.field_2 + 8));
        }
        else {
          pcVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   c_str((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         st.__glibc_reserved[2]);
          iVar3 = stat(pcVar4,(stat *)&__range5);
          if (iVar3 != -1) {
            if (((uint)st.st_nlink & 0xf000) == 0x4000) {
              if (bVar1) {
                fileenumerator::fileenumerator
                          ((fileenumerator *)&__begin5.filter,(string *)st.__glibc_reserved[2],1,
                           SINGLE);
                fileenumerator::begin((iter *)&__end5.filter,(fileenumerator *)&__begin5.filter);
                fileenumerator::end((iter *)local_448,(fileenumerator *)&__begin5.filter);
                while (bVar2 = fileenumerator::iter::operator!=
                                         ((iter *)&__end5.filter,(iter *)local_448), bVar2) {
                  fileenumerator::iter::operator*[abi_cxx11_
                            ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fileenumerator::fileent>
                              *)&fn,(iter *)&__end5.filter);
                  fn_00 = std::get<0ul,std::__cxx11::string,fileenumerator::fileent>
                                    ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fileenumerator::fileent>
                                      *)&fn);
                  std::get<1ul,std::__cxx11::string,fileenumerator::fileent>
                            ((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fileenumerator::fileent>
                              *)&fn);
                  findstr::searchfile((findstr *)((long)&excludepaths.field_2 + 8),fn_00);
                  local_290 = 0;
                  std::
                  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fileenumerator::fileent>
                  ::~tuple((tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fileenumerator::fileent>
                            *)&fn);
                  if (local_290 != 0) goto LAB_0010b8fb;
                  fileenumerator::iter::operator++((iter *)&__end5.filter);
                }
                local_290 = 9;
LAB_0010b8fb:
                fileenumerator::iter::~iter((iter *)local_448);
                fileenumerator::iter::~iter((iter *)&__end5.filter);
                fileenumerator::~fileenumerator((fileenumerator *)&__begin5.filter);
              }
            }
            else {
              findstr::searchfile((findstr *)((long)&excludepaths.field_2 + 8),
                                  (string *)st.__glibc_reserved[2]);
            }
          }
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end1_1);
      }
      argv_local._4_4_ = 0;
    }
    else {
      argv_local._4_4_ = 1;
    }
  }
LAB_0010bad5:
  local_290 = 1;
  std::__cxx11::string::~string((string *)&__range1);
  findstr::~findstr((findstr *)((long)&excludepaths.field_2 + 8));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&f.bytemasks.
                super__Vector_base<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv)
{
    bool recurse_dirs = false;
    std::vector<std::string> args;
    findstr  f;
    std::string excludepaths;

    for (auto& arg : ArgParser(argc, argv))
        switch (arg.option())
        {
            case 'w': f.matchword = true; break;
            case 'b': f.matchbinary = true; break;
            case 'I': f.matchcase = true; break;
            case '0': f.matchstart = true; break;
            case '1': f.firstmatch = true; break;
            case 'x': f.pattern_is_hex = true; break;
            case 'g': f.pattern_is_guid = true; break;
            case 'v': f.verbose += arg.count(); break;
            case 'r': recurse_dirs = true; break;
            case 'l': f.list_only = true; break;
            case 'c': f.count_only = true; break;
            case 'f': f.readcontinuous = true; break;
            case 'M': f.maxfilesize = arg.getint(); break;
            //case 'X': excludepaths = arg.getstr(); break;
#ifdef WITH_MEMSEARCH
            case 'o': f.memoffset = arg.getint(); break;
            case 'L': f.memsize = arg.getint(); break;
            case 'h': f.pid = arg.getint(); break;
#endif
            case 'S': 
                      {
                      auto mode = arg.getstr();
                      if (mode == "regex"s) f.searchtype = REGEX_SEARCH;
                      else if (mode == "std"s) f.searchtype = STD_SEARCH;
                      else if (mode == "stdbm"s) f.searchtype = STD_BOYER_MOORE;
                      else if (mode == "stdbmh"s) f.searchtype = STD_BOYER_MOORE_HORSPOOL;
                      else if (mode == "boostbm"s) f.searchtype = BOOST_BOYER_MOORE;
                      else if (mode == "boostbmh"s) f.searchtype = BOOST_BOYER_MOORE_HORSPOOL;
                      else if (mode == "boostkmp"s) f.searchtype = BOOST_KNUTH_MORRIS_PRATT;
                      else if (mode == "mask"s) f.searchtype = BYTEMASK_SEARCH;
                      }
                      break;
            case 'Q': f.use_sequential = true; break;
            case 0:
                      args.push_back("-");
                      break;
            case -1:
                if (f.pattern.empty()) 
                    f.pattern = arg.getstr();
                else {
                    args.push_back(arg.getstr());
                }
                break;
            default:
                usage();
                return 1;
        }

    if (f.pattern.empty()) {
        usage();
        return 1;
    }
    if (f.pattern_is_hex) {
        f.matchbinary = true;
        f.matchcase = true;
    }
    //std::set<std::string> exclude;
    //for (auto i : tokenize(excludepaths, ':'))
    //    exclude.insert(i);

#ifdef WITH_MEMSEARCH
    if (!f.memoffset)
#endif
    if (args.empty())
        args.push_back("-");
    if (!f.compile_pattern())
        return 1;
    if (f.verbose > 1) {
        print("Compiled regex: %s\n", f.pattern);
        for (auto & bm : f.bytemasks) {
            print("Compiled bytes: %-b\n", bm.first);
            print("Compiled  mask: %-b\n", bm.second);
        }
    }
    bool stop = false;
#ifdef WITH_MEMSEARCH
    if (f.memoffset)
        catchall(f.searchmemory(), "memory");
#endif
    if (stop)
        return 0;

    for (auto const& arg : args) {
        if (arg == "-")
            f.searchstdin();
        else {
            struct stat st;
            if (-1 == stat(arg.c_str(), &st))
                continue;

            if ((st.st_mode & S_IFMT) == S_IFDIR) {
                if (recurse_dirs)
                    for (auto [fn, ent] : fileenumerator(arg))
                        catchall(f.searchfile(fn), fn);
            }
            //      [recurse_dirs,&exclude](const std::string& fn)->bool { 
            //          return exclude.find(fn)==exclude.end() && recurse_dirs;
            //      }
            else {
                catchall(f.searchfile(arg), arg);
            }
        }

        if (stop)
            return 0;
    }

    return 0;
}